

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O0

bool __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::request_slot(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
               *this,size_type slot,
              basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  bool bVar1;
  __type _Var2;
  uint uVar3;
  int in_R8D;
  undefined4 in_register_00000084;
  GlobalPtr<int> ptr;
  GlobalPtr<int> ptr_00;
  xor_<int> local_b8;
  GlobalPtr<int> local_a0;
  undefined4 local_8c;
  undefined1 local_88 [4];
  int xor_value;
  undefined1 local_68 [8];
  HME entry;
  size_t local_40;
  uint local_30;
  int return_value;
  int current_value;
  bool success;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  size_type slot_local;
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *this_local;
  
  bVar1 = false;
  local_30 = 0;
  do {
    join_0x00000010_0x00000000_ = slot_used_ptr(this,slot);
    ptr.ptr._0_4_ = local_30;
    ptr.rank = local_40;
    ptr.ptr._4_4_ = 0;
    uVar3 = int_compare_and_swap((BCL *)entry._24_8_,ptr,1,in_R8D);
    if (local_30 == uVar3) {
      bVar1 = true;
    }
    if (((uVar3 & 2) != 0) || ((uVar3 & 1) != 0)) {
      local_30 = 2;
    }
  } while (!bVar1);
  if ((uVar3 & 2) == 0) {
    this_local._7_1_ = true;
  }
  else {
    get_entry((HME *)local_68,this,slot);
    HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
    ::get_key((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
              (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
               *)local_68);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,key);
    std::__cxx11::string::~string((string *)local_88);
    if (_Var2) {
      this_local._7_1_ = true;
    }
    else {
      local_8c = 3;
      local_a0 = slot_used_ptr(this,slot);
      memset(&local_b8,0,0x18);
      xor_<int>::xor_(&local_b8);
      ptr_00.ptr = (size_t)&local_8c;
      ptr_00.rank = local_a0.ptr;
      fetch_and_op<int>((BCL *)local_a0.rank,ptr_00,(int *)&local_b8.super_atomic_op<int>,
                        (atomic_op<int> *)CONCAT44(in_register_00000084,in_R8D));
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool request_slot(size_type slot, const Key& key) {
    bool success = false;
    int current_value = free_flag;
    int return_value;

    do {
      return_value = BCL::int_compare_and_swap(slot_used_ptr(slot),
                                               current_value, reserved_flag);
      if (current_value == return_value) {
        success = true;
      }

      if (return_value & ready_flag || return_value & reserved_flag) {
        current_value = ready_flag;
      }
    } while (!success);

    // At this point, you have slot -> reserved_flag

    if (return_value & ready_flag) {
      HME entry = get_entry(slot);
      if (entry.get_key() == key) {
        return true;
      } else {
        int xor_value = 0x3;
        BCL::fetch_and_op<int>(slot_used_ptr(slot), xor_value, BCL::xor_<int>{});
        return false;
      }
    } else {
      return true;
    }
  }